

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc3::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,Interval *xi,
          Interval *yi,Interval *zi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Interval *pIVar4;
  Interval **ppIVar5;
  undefined8 uVar6;
  double *pdVar7;
  undefined8 *puVar8;
  double *pdVar9;
  double dVar10;
  bool bVar11;
  deBool dVar12;
  undefined4 uVar13;
  float fVar14;
  Interval local_9b0;
  Interval *local_998;
  double local_990;
  double local_988;
  Interval local_980;
  double local_968;
  double local_960;
  double local_958;
  Interval local_950;
  double local_938;
  double local_930;
  double local_928;
  Interval local_920;
  Interval *local_908;
  Interval *pIStack_900;
  Interval *local_8f8;
  Interval **local_8f0;
  Interval *point_15;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  double *local_8d0;
  Interval *point_14;
  Interval point_hi__7;
  Interval point_lo__7;
  Interval *point_dst__7;
  undefined8 *puStack_888;
  ScopedRoundingMode point_ctx__7;
  Interval *ret_7;
  double z_7;
  double local_870;
  double local_868;
  Interval *local_860;
  Interval *pIStack_858;
  Interval *local_850;
  Interval **local_848;
  Interval *point_13;
  undefined8 uStack_838;
  undefined8 local_830;
  double *local_828;
  Interval *point_12;
  Interval point_hi__6;
  Interval point_lo__6;
  Interval *point_dst__6;
  double *pdStack_7e0;
  ScopedRoundingMode point_ctx__6;
  Interval *ret_6;
  double z_6;
  double local_7c8;
  double local_7c0;
  undefined1 local_7b8 [8];
  Interval ret_hi__3;
  Interval ret_lo__3;
  Interval *ret_dst__3;
  Interval *ret_arg__3;
  Interval *tmp2__3;
  double y_3;
  double local_750 [3];
  Interval local_738;
  Interval *local_720;
  Interval *pIStack_718;
  Interval *local_710;
  Interval **local_708;
  Interval *point_11;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  double *local_6e8;
  Interval *point_10;
  Interval point_hi__5;
  Interval point_lo__5;
  Interval *point_dst__5;
  undefined8 *puStack_6a0;
  ScopedRoundingMode point_ctx__5;
  Interval *ret_5;
  double z_5;
  double local_688;
  double local_680;
  Interval *local_678;
  Interval *pIStack_670;
  Interval *local_668;
  Interval **local_660;
  Interval *point_9;
  undefined8 uStack_650;
  undefined8 local_648;
  double *local_640;
  Interval *point_8;
  Interval point_hi__4;
  Interval point_lo__4;
  Interval *point_dst__4;
  double *pdStack_5f8;
  ScopedRoundingMode point_ctx__4;
  Interval *ret_4;
  double z_4;
  undefined1 local_5d0 [8];
  Interval ret_hi__2;
  Interval ret_lo__2;
  Interval *ret_dst__2;
  Interval *ret_arg__2;
  Interval *tmp2__2;
  double y_2;
  double local_578;
  double local_570;
  double local_568;
  Interval tmp2__hi__1;
  Interval tmp2__lo__1;
  Interval *tmp2__dst__1;
  Interval *tmp2__arg__1;
  Interval *tmp3__1;
  double x_1;
  double local_500 [3];
  Interval local_4e8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  Interval local_4b8;
  Interval *local_4a0;
  Interval *pIStack_498;
  Interval *local_490;
  Interval **local_488;
  Interval *point_7;
  undefined8 uStack_478;
  undefined8 local_470;
  double *local_468;
  Interval *point_6;
  Interval point_hi__3;
  Interval point_lo__3;
  Interval *point_dst__3;
  undefined8 *puStack_420;
  ScopedRoundingMode point_ctx__3;
  Interval *ret_3;
  double z_3;
  double local_408;
  double local_400;
  Interval *local_3f8;
  Interval *pIStack_3f0;
  Interval *local_3e8;
  Interval **local_3e0;
  Interval *point_5;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  double *local_3c0;
  Interval *point_4;
  Interval point_hi__2;
  Interval point_lo__2;
  Interval *point_dst__2;
  double *pdStack_378;
  ScopedRoundingMode point_ctx__2;
  Interval *ret_2;
  double z_2;
  double local_360;
  double local_358;
  undefined1 local_350 [8];
  Interval ret_hi__1;
  Interval ret_lo__1;
  Interval *ret_dst__1;
  Interval *ret_arg__1;
  Interval *tmp2__1;
  double y_1;
  double local_2e8 [3];
  Interval local_2d0;
  Interval *local_2b8;
  Interval *pIStack_2b0;
  Interval *local_2a8;
  Interval **local_2a0;
  Interval *point_3;
  undefined8 uStack_290;
  undefined8 local_288;
  double *local_280;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_238;
  ScopedRoundingMode point_ctx__1;
  Interval *ret_1;
  double z_1;
  double local_220;
  double local_218;
  Interval *local_210;
  Interval *pIStack_208;
  Interval *local_200;
  Interval **local_1f8;
  Interval *point_1;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d8;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_1a8 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_180;
  ScopedRoundingMode point_ctx_;
  Interval *ret;
  double z;
  undefined1 local_158 [8];
  Interval ret_hi_;
  Interval ret_lo_;
  Interval *ret_dst_;
  Interval *ret_arg_;
  Interval *tmp2_;
  double y;
  double local_f0;
  Interval tmp2__hi_;
  Interval tmp2__lo_;
  Interval *tmp2__dst_;
  Interval *tmp2__arg_;
  Interval *tmp3_;
  double x;
  double local_98;
  double local_90;
  double local_88;
  Interval tmp3__hi_;
  Interval tmp3__lo_;
  Interval *tmp3__dst_;
  Interval *tmp3__arg_;
  Interval reti;
  Interval *zi_local;
  Interval *yi_local;
  Interval *xi_local;
  EvalContext *ctx_local;
  FloatFunc3 *this_local;
  
  reti.m_hi = (double)zi;
  tcu::Interval::Interval((Interval *)&tmp3__arg_);
  do {
    tcu::Interval::Interval((Interval *)&tmp3__hi_.m_hi);
    tcu::Interval::Interval((Interval *)&local_88);
    bVar11 = tcu::Interval::empty(xi);
    if (bVar11) {
      tcu::Interval::Interval((Interval *)&x);
      tmp3__arg_ = (Interval *)x;
      reti._0_8_ = local_98;
      reti.m_lo = local_90;
    }
    else {
      dVar1 = tcu::Interval::lo(xi);
      do {
        tcu::Interval::Interval((Interval *)&tmp2__hi_.m_hi);
        tcu::Interval::Interval((Interval *)&local_f0);
        bVar11 = tcu::Interval::empty(yi);
        if (bVar11) {
          tcu::Interval::Interval((Interval *)&y);
          tmp3__hi_.m_hi = y;
        }
        else {
          dVar2 = tcu::Interval::lo(yi);
          do {
            dVar10 = reti.m_hi;
            tcu::Interval::Interval((Interval *)&ret_hi_.m_hi);
            tcu::Interval::Interval((Interval *)local_158);
            bVar11 = tcu::Interval::empty((Interval *)dVar10);
            uVar13 = SUB84(dVar1,0);
            if (bVar11) {
              tcu::Interval::Interval((Interval *)&z);
              tmp2__hi_.m_hi = z;
            }
            else {
              dVar3 = tcu::Interval::lo((Interval *)dVar10);
              pdStack_180 = &ret_hi_.m_hi;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst_ + 4));
                point_lo_.m_hi = (double)pdStack_180;
                tcu::Interval::Interval((Interval *)auStack_1a8);
                tcu::Interval::Interval((Interval *)&point);
                local_1d8 = (undefined8 *)auStack_1a8;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_1,this,ctx);
                puVar8 = local_1d8;
                local_1d8[2] = local_1e0;
                uVar6 = uStack_1e8;
                *puVar8 = point_1;
                puVar8[1] = uVar6;
                local_1f8 = &point;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_210,this,ctx);
                ppIVar5 = local_1f8;
                local_1f8[2] = local_200;
                pIVar4 = pIStack_208;
                *ppIVar5 = local_210;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          ((Interval *)&z_1,(Interval *)auStack_1a8,(Interval *)&point);
                *(double *)point_lo_.m_hi = z_1;
                *(double *)((long)point_lo_.m_hi + 8) = local_220;
                *(double *)((long)point_lo_.m_hi + 0x10) = local_218;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst_ + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              dVar3 = tcu::Interval::hi((Interval *)dVar10);
              puStack_238 = (undefined8 *)local_158;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
                puVar8 = puStack_238;
                tcu::Interval::Interval((Interval *)&point_hi__1.m_hi);
                tcu::Interval::Interval((Interval *)&point_2);
                local_280 = &point_hi__1.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_3,this,ctx);
                pdVar7 = local_280;
                local_280[2] = (double)local_288;
                uVar6 = uStack_290;
                *pdVar7 = (double)point_3;
                pdVar7[1] = (double)uVar6;
                local_2a0 = &point_2;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_2b8,this,ctx);
                ppIVar5 = local_2a0;
                local_2a0[2] = local_2a8;
                pIVar4 = pIStack_2b0;
                *ppIVar5 = local_2b8;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          (&local_2d0,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
                *puVar8 = local_2d0._0_8_;
                puVar8[1] = local_2d0.m_lo;
                puVar8[2] = local_2d0.m_hi;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              tcu::Interval::operator|
                        ((Interval *)local_2e8,(Interval *)&ret_hi_.m_hi,(Interval *)local_158);
              tmp2__hi_.m_hi = local_2e8[0];
            }
            bVar11 = tcu::Interval::hasNaN((Interval *)dVar10);
            if (bVar11) {
              fVar14 = std::numeric_limits<float>::quiet_NaN();
              tcu::Interval::Interval((Interval *)&y_1,(double)fVar14);
              tcu::Interval::operator|=((Interval *)&tmp2__hi_.m_hi,(Interval *)&y_1);
            }
            dVar12 = ::deGetFalse();
          } while (dVar12 != 0);
          dVar2 = tcu::Interval::hi(yi);
          do {
            dVar10 = reti.m_hi;
            tcu::Interval::Interval((Interval *)&ret_hi__1.m_hi);
            tcu::Interval::Interval((Interval *)local_350);
            bVar11 = tcu::Interval::empty((Interval *)dVar10);
            if (bVar11) {
              tcu::Interval::Interval((Interval *)&z_2);
              local_f0 = z_2;
              tmp2__hi_._0_8_ = local_360;
              tmp2__hi_.m_lo = local_358;
            }
            else {
              dVar3 = tcu::Interval::lo((Interval *)dVar10);
              pdStack_378 = &ret_hi__1.m_hi;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
                pdVar9 = pdStack_378;
                tcu::Interval::Interval((Interval *)&point_hi__2.m_hi);
                tcu::Interval::Interval((Interval *)&point_4);
                local_3c0 = &point_hi__2.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_5,this,ctx);
                pdVar7 = local_3c0;
                local_3c0[2] = (double)local_3c8;
                uVar6 = uStack_3d0;
                *pdVar7 = (double)point_5;
                pdVar7[1] = (double)uVar6;
                local_3e0 = &point_4;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_3f8,this,ctx);
                ppIVar5 = local_3e0;
                local_3e0[2] = local_3e8;
                pIVar4 = pIStack_3f0;
                *ppIVar5 = local_3f8;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          ((Interval *)&z_3,(Interval *)&point_hi__2.m_hi,(Interval *)&point_4);
                *pdVar9 = z_3;
                pdVar9[1] = local_408;
                pdVar9[2] = local_400;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              dVar3 = tcu::Interval::hi((Interval *)dVar10);
              puStack_420 = (undefined8 *)local_350;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
                puVar8 = puStack_420;
                tcu::Interval::Interval((Interval *)&point_hi__3.m_hi);
                tcu::Interval::Interval((Interval *)&point_6);
                local_468 = &point_hi__3.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_7,this,ctx);
                pdVar7 = local_468;
                local_468[2] = (double)local_470;
                uVar6 = uStack_478;
                *pdVar7 = (double)point_7;
                pdVar7[1] = (double)uVar6;
                local_488 = &point_6;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_4a0,this,ctx);
                ppIVar5 = local_488;
                local_488[2] = local_490;
                pIVar4 = pIStack_498;
                *ppIVar5 = local_4a0;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          (&local_4b8,(Interval *)&point_hi__3.m_hi,(Interval *)&point_6);
                *puVar8 = local_4b8._0_8_;
                puVar8[1] = local_4b8.m_lo;
                puVar8[2] = local_4b8.m_hi;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              tcu::Interval::operator|
                        ((Interval *)&local_4d0,(Interval *)&ret_hi__1.m_hi,(Interval *)local_350);
              local_f0 = local_4d0;
              tmp2__hi_._0_8_ = local_4c8;
              tmp2__hi_.m_lo = local_4c0;
            }
            bVar11 = tcu::Interval::hasNaN((Interval *)dVar10);
            if (bVar11) {
              fVar14 = std::numeric_limits<float>::quiet_NaN();
              tcu::Interval::Interval(&local_4e8,(double)fVar14);
              tcu::Interval::operator|=((Interval *)&local_f0,&local_4e8);
            }
            dVar12 = ::deGetFalse();
          } while (dVar12 != 0);
          tcu::Interval::operator|
                    ((Interval *)local_500,(Interval *)&tmp2__hi_.m_hi,(Interval *)&local_f0);
          tmp3__hi_.m_hi = local_500[0];
        }
        bVar11 = tcu::Interval::hasNaN(yi);
        if (bVar11) {
          fVar14 = std::numeric_limits<float>::quiet_NaN();
          tcu::Interval::Interval((Interval *)&x_1,(double)fVar14);
          tcu::Interval::operator|=((Interval *)&tmp3__hi_.m_hi,(Interval *)&x_1);
        }
        dVar12 = ::deGetFalse();
      } while (dVar12 != 0);
      dVar1 = tcu::Interval::hi(xi);
      do {
        tcu::Interval::Interval((Interval *)&tmp2__hi__1.m_hi);
        tcu::Interval::Interval((Interval *)&local_568);
        bVar11 = tcu::Interval::empty(yi);
        if (bVar11) {
          tcu::Interval::Interval((Interval *)&y_2);
          local_88 = y_2;
          tmp3__hi_._0_8_ = local_578;
          tmp3__hi_.m_lo = local_570;
        }
        else {
          dVar2 = tcu::Interval::lo(yi);
          do {
            dVar10 = reti.m_hi;
            tcu::Interval::Interval((Interval *)&ret_hi__2.m_hi);
            tcu::Interval::Interval((Interval *)local_5d0);
            bVar11 = tcu::Interval::empty((Interval *)dVar10);
            uVar13 = SUB84(dVar1,0);
            if (bVar11) {
              tcu::Interval::Interval((Interval *)&z_4);
              tmp2__hi__1.m_hi = z_4;
            }
            else {
              dVar3 = tcu::Interval::lo((Interval *)dVar10);
              pdStack_5f8 = &ret_hi__2.m_hi;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__4 + 4));
                pdVar9 = pdStack_5f8;
                tcu::Interval::Interval((Interval *)&point_hi__4.m_hi);
                tcu::Interval::Interval((Interval *)&point_8);
                local_640 = &point_hi__4.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_9,this,ctx);
                pdVar7 = local_640;
                local_640[2] = (double)local_648;
                uVar6 = uStack_650;
                *pdVar7 = (double)point_9;
                pdVar7[1] = (double)uVar6;
                local_660 = &point_8;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_678,this,ctx);
                ppIVar5 = local_660;
                local_660[2] = local_668;
                pIVar4 = pIStack_670;
                *ppIVar5 = local_678;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          ((Interval *)&z_5,(Interval *)&point_hi__4.m_hi,(Interval *)&point_8);
                *pdVar9 = z_5;
                pdVar9[1] = local_688;
                pdVar9[2] = local_680;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__4 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              dVar3 = tcu::Interval::hi((Interval *)dVar10);
              puStack_6a0 = (undefined8 *)local_5d0;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__5 + 4));
                puVar8 = puStack_6a0;
                tcu::Interval::Interval((Interval *)&point_hi__5.m_hi);
                tcu::Interval::Interval((Interval *)&point_10);
                local_6e8 = &point_hi__5.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_11,this,ctx);
                pdVar7 = local_6e8;
                local_6e8[2] = (double)local_6f0;
                uVar6 = uStack_6f8;
                *pdVar7 = (double)point_11;
                pdVar7[1] = (double)uVar6;
                local_708 = &point_10;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_720,this,ctx);
                ppIVar5 = local_708;
                local_708[2] = local_710;
                pIVar4 = pIStack_718;
                *ppIVar5 = local_720;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          (&local_738,(Interval *)&point_hi__5.m_hi,(Interval *)&point_10);
                *puVar8 = local_738._0_8_;
                puVar8[1] = local_738.m_lo;
                puVar8[2] = local_738.m_hi;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__5 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              tcu::Interval::operator|
                        ((Interval *)local_750,(Interval *)&ret_hi__2.m_hi,(Interval *)local_5d0);
              tmp2__hi__1.m_hi = local_750[0];
            }
            bVar11 = tcu::Interval::hasNaN((Interval *)dVar10);
            if (bVar11) {
              fVar14 = std::numeric_limits<float>::quiet_NaN();
              tcu::Interval::Interval((Interval *)&y_3,(double)fVar14);
              tcu::Interval::operator|=((Interval *)&tmp2__hi__1.m_hi,(Interval *)&y_3);
            }
            dVar12 = ::deGetFalse();
          } while (dVar12 != 0);
          dVar2 = tcu::Interval::hi(yi);
          do {
            dVar10 = reti.m_hi;
            tcu::Interval::Interval((Interval *)&ret_hi__3.m_hi);
            tcu::Interval::Interval((Interval *)local_7b8);
            bVar11 = tcu::Interval::empty((Interval *)dVar10);
            if (bVar11) {
              tcu::Interval::Interval((Interval *)&z_6);
              local_568 = z_6;
              tmp2__hi__1._0_8_ = local_7c8;
              tmp2__hi__1.m_lo = local_7c0;
            }
            else {
              dVar3 = tcu::Interval::lo((Interval *)dVar10);
              pdStack_7e0 = &ret_hi__3.m_hi;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__6 + 4));
                pdVar9 = pdStack_7e0;
                tcu::Interval::Interval((Interval *)&point_hi__6.m_hi);
                tcu::Interval::Interval((Interval *)&point_12);
                local_828 = &point_hi__6.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_13,this,ctx);
                pdVar7 = local_828;
                local_828[2] = (double)local_830;
                uVar6 = uStack_838;
                *pdVar7 = (double)point_13;
                pdVar7[1] = (double)uVar6;
                local_848 = &point_12;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_860,this,ctx);
                ppIVar5 = local_848;
                local_848[2] = local_850;
                pIVar4 = pIStack_858;
                *ppIVar5 = local_860;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          ((Interval *)&z_7,(Interval *)&point_hi__6.m_hi,(Interval *)&point_12);
                *pdVar9 = z_7;
                pdVar9[1] = local_870;
                pdVar9[2] = local_868;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__6 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              dVar3 = tcu::Interval::hi((Interval *)dVar10);
              puStack_888 = (undefined8 *)local_7b8;
              do {
                tcu::ScopedRoundingMode::ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__7 + 4));
                puVar8 = puStack_888;
                tcu::Interval::Interval((Interval *)&point_hi__7.m_hi);
                tcu::Interval::Interval((Interval *)&point_14);
                local_8d0 = &point_hi__7.m_hi;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&point_15,this,ctx);
                pdVar7 = local_8d0;
                local_8d0[2] = (double)local_8d8;
                uVar6 = uStack_8e0;
                *pdVar7 = (double)point_15;
                pdVar7[1] = (double)uVar6;
                local_8f0 = &point_14;
                deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
                (**(code **)(*(long *)this + 0x58))(uVar13,dVar2,dVar3,&local_908,this,ctx);
                ppIVar5 = local_8f0;
                local_8f0[2] = local_8f8;
                pIVar4 = pIStack_900;
                *ppIVar5 = local_908;
                ppIVar5[1] = pIVar4;
                tcu::Interval::operator|
                          (&local_920,(Interval *)&point_hi__7.m_hi,(Interval *)&point_14);
                *puVar8 = local_920._0_8_;
                puVar8[1] = local_920.m_lo;
                puVar8[2] = local_920.m_hi;
                tcu::ScopedRoundingMode::~ScopedRoundingMode
                          ((ScopedRoundingMode *)((long)&point_dst__7 + 4));
                dVar12 = ::deGetFalse();
              } while (dVar12 != 0);
              tcu::Interval::operator|
                        ((Interval *)&local_938,(Interval *)&ret_hi__3.m_hi,(Interval *)local_7b8);
              local_568 = local_938;
              tmp2__hi__1._0_8_ = local_930;
              tmp2__hi__1.m_lo = local_928;
            }
            bVar11 = tcu::Interval::hasNaN((Interval *)dVar10);
            if (bVar11) {
              fVar14 = std::numeric_limits<float>::quiet_NaN();
              tcu::Interval::Interval(&local_950,(double)fVar14);
              tcu::Interval::operator|=((Interval *)&local_568,&local_950);
            }
            dVar12 = ::deGetFalse();
          } while (dVar12 != 0);
          tcu::Interval::operator|
                    ((Interval *)&local_968,(Interval *)&tmp2__hi__1.m_hi,(Interval *)&local_568);
          local_88 = local_968;
          tmp3__hi_._0_8_ = local_960;
          tmp3__hi_.m_lo = local_958;
        }
        bVar11 = tcu::Interval::hasNaN(yi);
        if (bVar11) {
          fVar14 = std::numeric_limits<float>::quiet_NaN();
          tcu::Interval::Interval(&local_980,(double)fVar14);
          tcu::Interval::operator|=((Interval *)&local_88,&local_980);
        }
        dVar12 = ::deGetFalse();
      } while (dVar12 != 0);
      tcu::Interval::operator|
                ((Interval *)&local_998,(Interval *)&tmp3__hi_.m_hi,(Interval *)&local_88);
      tmp3__arg_ = local_998;
      reti._0_8_ = local_990;
      reti.m_lo = local_988;
    }
    bVar11 = tcu::Interval::hasNaN(xi);
    if (bVar11) {
      fVar14 = std::numeric_limits<float>::quiet_NaN();
      tcu::Interval::Interval(&local_9b0,(double)fVar14);
      tcu::Interval::operator|=((Interval *)&tmp3__arg_,&local_9b0);
    }
    dVar12 = ::deGetFalse();
  } while (dVar12 != 0);
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)&tmp3__arg_);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi,
										 const Interval&	zi) const
	{
		Interval reti;
		TCU_INTERVAL_APPLY_MONOTONE3(reti, x, xi, y, yi, z, zi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y, z)));
		return ctx.format.convert(reti);
	}